

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonRenderNode(JsonNode *pNode,JsonString *pOut,sqlite3_value **aReplace)

{
  u32 uVar1;
  uint local_28;
  uint local_24;
  u32 j_1;
  u32 j;
  sqlite3_value **aReplace_local;
  JsonString *pOut_local;
  JsonNode *pNode_local;
  
  pOut_local = (JsonString *)pNode;
  if ((pNode->jnFlags & 0x18) != 0) {
    if ((pNode->jnFlags & 8) != 0) {
      jsonAppendValue(pOut,aReplace[(pNode->u).iAppend]);
      return;
    }
    pOut_local = (JsonString *)(pNode->u).pPatch;
  }
  switch(*(undefined1 *)&pOut_local->pCtx) {
  case 1:
    jsonAppendRaw(pOut,"true",4);
    break;
  case 2:
    jsonAppendRaw(pOut,"false",5);
    break;
  case 5:
    if (((ulong)pOut_local->pCtx & 0x100) != 0) {
      jsonAppendString(pOut,pOut_local->zBuf,*(u32 *)((long)&pOut_local->pCtx + 4));
      return;
    }
  case 3:
  case 4:
    jsonAppendRaw(pOut,pOut_local->zBuf,*(u32 *)((long)&pOut_local->pCtx + 4));
    break;
  case 6:
    jsonAppendChar(pOut,'[');
    while( true ) {
      for (local_24 = 1; local_24 <= *(uint *)((long)&pOut_local->pCtx + 4);
          local_24 = uVar1 + local_24) {
        if ((pOut_local->zSpace[(ulong)local_24 * 0x10 + -0x21] & 4U) == 0) {
          jsonAppendSeparator(pOut);
          jsonRenderNode((JsonNode *)(pOut_local->zSpace + (ulong)local_24 * 0x10 + -0x22),pOut,
                         aReplace);
        }
        uVar1 = jsonNodeSize((JsonNode *)(pOut_local->zSpace + (ulong)local_24 * 0x10 + -0x22));
      }
      if (((ulong)pOut_local->pCtx & 0x2000) == 0) break;
      pOut_local = (JsonString *)
                   (pOut_local->zSpace + (ulong)*(uint *)&pOut_local->zBuf * 0x10 + -0x22);
    }
    jsonAppendChar(pOut,']');
    break;
  case 7:
    jsonAppendChar(pOut,'{');
    while( true ) {
      for (local_28 = 1; local_28 <= *(uint *)((long)&pOut_local->pCtx + 4);
          local_28 = uVar1 + 1 + local_28) {
        if ((pOut_local->zSpace[(ulong)(local_28 + 1) * 0x10 + -0x21] & 4U) == 0) {
          jsonAppendSeparator(pOut);
          jsonRenderNode((JsonNode *)(pOut_local->zSpace + (ulong)local_28 * 0x10 + -0x22),pOut,
                         aReplace);
          jsonAppendChar(pOut,':');
          jsonRenderNode((JsonNode *)(pOut_local->zSpace + (ulong)(local_28 + 1) * 0x10 + -0x22),
                         pOut,aReplace);
        }
        uVar1 = jsonNodeSize((JsonNode *)(pOut_local->zSpace + (ulong)(local_28 + 1) * 0x10 + -0x22)
                            );
      }
      if (((ulong)pOut_local->pCtx & 0x2000) == 0) break;
      pOut_local = (JsonString *)
                   (pOut_local->zSpace + (ulong)*(uint *)&pOut_local->zBuf * 0x10 + -0x22);
    }
    jsonAppendChar(pOut,'}');
    break;
  default:
    jsonAppendRaw(pOut,"null",4);
  }
  return;
}

Assistant:

static void jsonRenderNode(
  JsonNode *pNode,               /* The node to render */
  JsonString *pOut,              /* Write JSON here */
  sqlite3_value **aReplace       /* Replacement values */
){
  if( pNode->jnFlags & (JNODE_REPLACE|JNODE_PATCH) ){
    if( pNode->jnFlags & JNODE_REPLACE ){
      jsonAppendValue(pOut, aReplace[pNode->u.iReplace]);
      return;
    }
    pNode = pNode->u.pPatch;
  }
  switch( pNode->eType ){
    default: {
      assert( pNode->eType==JSON_NULL );
      jsonAppendRaw(pOut, "null", 4);
      break;
    }
    case JSON_TRUE: {
      jsonAppendRaw(pOut, "true", 4);
      break;
    }
    case JSON_FALSE: {
      jsonAppendRaw(pOut, "false", 5);
      break;
    }
    case JSON_STRING: {
      if( pNode->jnFlags & JNODE_RAW ){
        jsonAppendString(pOut, pNode->u.zJContent, pNode->n);
        break;
      }
      /* Fall through into the next case */
    }
    case JSON_REAL:
    case JSON_INT: {
      jsonAppendRaw(pOut, pNode->u.zJContent, pNode->n);
      break;
    }
    case JSON_ARRAY: {
      u32 j = 1;
      jsonAppendChar(pOut, '[');
      for(;;){
        while( j<=pNode->n ){
          if( (pNode[j].jnFlags & JNODE_REMOVE)==0 ){
            jsonAppendSeparator(pOut);
            jsonRenderNode(&pNode[j], pOut, aReplace);
          }
          j += jsonNodeSize(&pNode[j]);
        }
        if( (pNode->jnFlags & JNODE_APPEND)==0 ) break;
        pNode = &pNode[pNode->u.iAppend];
        j = 1;
      }
      jsonAppendChar(pOut, ']');
      break;
    }
    case JSON_OBJECT: {
      u32 j = 1;
      jsonAppendChar(pOut, '{');
      for(;;){
        while( j<=pNode->n ){
          if( (pNode[j+1].jnFlags & JNODE_REMOVE)==0 ){
            jsonAppendSeparator(pOut);
            jsonRenderNode(&pNode[j], pOut, aReplace);
            jsonAppendChar(pOut, ':');
            jsonRenderNode(&pNode[j+1], pOut, aReplace);
          }
          j += 1 + jsonNodeSize(&pNode[j+1]);
        }
        if( (pNode->jnFlags & JNODE_APPEND)==0 ) break;
        pNode = &pNode[pNode->u.iAppend];
        j = 1;
      }
      jsonAppendChar(pOut, '}');
      break;
    }
  }
}